

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_initCStream_advanced
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_CCtx_params params_00;
  ZSTD_parameters ZVar1;
  size_t sVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  ulong pledgedSrcSize_00;
  byte bVar6;
  ZSTD_CCtx_params ret;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [24];
  undefined1 in_stack_fffffffffffffef4 [92];
  undefined1 auVar17 [24];
  undefined1 local_a8 [12];
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  ZSTD_strategy ZStack_8c;
  undefined8 local_88;
  uint local_80;
  undefined4 local_7c;
  
  ZVar1 = params;
  bVar6 = 0;
  uVar12 = params.cParams.searchLength;
  uVar8 = params.cParams.hashLog;
  uVar10 = params.cParams.searchLog;
  uVar7 = params.cParams._0_8_;
  uVar9 = uVar8;
  uVar11 = uVar10;
  uVar13 = uVar12;
  uVar14 = params.cParams._20_8_;
  sVar2 = ZSTD_checkCParams(params.cParams);
  if (sVar2 < 0xffffffffffffff89) {
    pledgedSrcSize_00 = -(ulong)(params.fParams.contentSizeFlag == 0) | pledgedSrcSize;
    if (pledgedSrcSize != 0) {
      pledgedSrcSize_00 = pledgedSrcSize;
    }
    memcpy(local_a8,&zcs->requestedParams,0x78);
    local_a8._4_4_ = params.cParams.windowLog;
    local_a8._8_4_ = params.cParams.chainLog;
    uStack_90 = params.cParams.targetLength;
    ZStack_8c = params.cParams.strategy;
    local_88 = ZVar1.fParams._0_8_;
    local_80 = params.fParams.noDictIDFlag;
    local_7c = 3;
    puVar4 = (undefined8 *)local_a8;
    puVar5 = (undefined8 *)&stack0xfffffffffffffed8;
    uStack_9c = uVar8;
    uStack_98 = uVar10;
    uStack_94 = uVar12;
    for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar5 = *puVar4;
      puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    params_00.cParams.chainLog = uVar9;
    params_00.format = (uint)uVar7;
    params_00.cParams.windowLog = SUB84(uVar7,4);
    params_00.cParams.hashLog = uVar11;
    params_00.cParams.searchLog = uVar13;
    params_00.cParams.searchLength = (uint)uVar14;
    params_00.cParams.targetLength = SUB84(uVar14,4);
    auVar15 = in_stack_fffffffffffffef4._4_12_;
    auVar16 = in_stack_fffffffffffffef4._40_24_;
    auVar17 = in_stack_fffffffffffffef4._68_24_;
    params_00.cParams.strategy = in_stack_fffffffffffffef4._0_4_;
    params_00.fParams.contentSizeFlag = auVar15._0_4_;
    params_00.fParams.checksumFlag = auVar15._4_4_;
    params_00.fParams.noDictIDFlag = auVar15._8_4_;
    params_00.compressionLevel = in_stack_fffffffffffffef4._16_4_;
    params_00.disableLiteralCompression = in_stack_fffffffffffffef4._20_4_;
    params_00.forceWindow = in_stack_fffffffffffffef4._24_4_;
    params_00.nbWorkers = in_stack_fffffffffffffef4._28_4_;
    params_00.jobSize = in_stack_fffffffffffffef4._32_4_;
    params_00.overlapSizeLog = in_stack_fffffffffffffef4._36_4_;
    params_00.ldmParams.enableLdm = auVar16._0_4_;
    params_00.ldmParams.hashLog = auVar16._4_4_;
    params_00.ldmParams.bucketSizeLog = auVar16._8_4_;
    params_00.ldmParams.minMatchLength = auVar16._12_4_;
    params_00.ldmParams.hashEveryLog = auVar16._16_4_;
    params_00.ldmParams.windowLog = auVar16._20_4_;
    params_00._92_4_ = in_stack_fffffffffffffef4._64_4_;
    params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar17._0_8_;
    params_00.customMem.customFree = (ZSTD_freeFunction)auVar17._8_8_;
    params_00.customMem.opaque = (void *)auVar17._16_8_;
    sVar2 = ZSTD_initCStream_internal
                      (zcs,dict,dictSize,(ZSTD_CDict *)0x0,params_00,pledgedSrcSize_00);
  }
  return sVar2;
}

Assistant:

size_t ZSTD_initCStream_advanced(ZSTD_CStream* zcs,
                                 const void* dict, size_t dictSize,
                                 ZSTD_parameters params, unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_advanced: pledgedSrcSize=%u, flag=%u",
                (U32)pledgedSrcSize, params.fParams.contentSizeFlag);
    CHECK_F( ZSTD_checkCParams(params.cParams) );
    if ((pledgedSrcSize==0) && (params.fParams.contentSizeFlag==0)) pledgedSrcSize = ZSTD_CONTENTSIZE_UNKNOWN;  /* for compatibility with older programs relying on this behavior. Users should now specify ZSTD_CONTENTSIZE_UNKNOWN. This line will be removed in the future. */
    {   ZSTD_CCtx_params const cctxParams = ZSTD_assignParamsToCCtxParams(zcs->requestedParams, params);
        return ZSTD_initCStream_internal(zcs, dict, dictSize, NULL /*cdict*/, cctxParams, pledgedSrcSize);
    }
}